

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::DipoleField::getValue(Vector3d *__return_storage_ptr__,DipoleField *this,StuntDouble *sd)

{
  double *pdVar1;
  AtomType *pAVar2;
  long lVar3;
  RealType RVar4;
  bool bVar5;
  uint i;
  long lVar6;
  _func_int *p_Var7;
  _func_int **pp_Var8;
  RigidBody *rb;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  Vector<double,_3U> result;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  double local_98 [4];
  double local_78 [4];
  FluctuatingChargeAdapter local_58;
  FixedChargeAdapter local_50;
  double local_48 [3];
  
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  if (sd->objType_ == otRigidBody) {
    pp_Var8 = (_func_int **)sd[2].mass_;
    if ((pp_Var8 != sd[2].properties_._vptr_PropertyMap) &&
       (p_Var7 = *pp_Var8, p_Var7 != (_func_int *)0x0)) {
      do {
        pAVar2 = *(AtomType **)(p_Var7 + 0x78);
        local_50.at_ = pAVar2;
        bVar5 = FixedChargeAdapter::isFixedCharge(&local_50);
        uVar9 = 0;
        uVar10 = 0;
        if (bVar5) {
          RVar4 = FixedChargeAdapter::getCharge(&local_50);
          uVar9 = SUB84(RVar4,0);
          uVar10 = (undefined4)((ulong)RVar4 >> 0x20);
        }
        dVar11 = (double)CONCAT44(uVar10,uVar9);
        local_58.at_ = pAVar2;
        bVar5 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_58);
        if (bVar5) {
          lVar6 = (long)*(int *)(p_Var7 + 0x30);
          dVar11 = dVar11 + *(double *)
                             (*(long *)(*(long *)(*(long *)(p_Var7 + 0x18) + 0x18) + 0x150 +
                                       *(long *)(p_Var7 + 0x10)) + lVar6 * 8);
        }
        else {
          lVar6 = (long)*(int *)(p_Var7 + 0x30);
        }
        lVar3 = *(long *)(*(long *)(*(long *)(p_Var7 + 0x18) + 0x18) + *(long *)(p_Var7 + 0x10));
        local_78[2] = (double)*(undefined8 *)(lVar3 + 0x10 + lVar6 * 0x18);
        pdVar1 = (double *)(lVar3 + lVar6 * 0x18);
        local_78[0] = *pdVar1;
        local_78[1] = pdVar1[1];
        local_48[0] = 0.0;
        local_48[1] = 0.0;
        local_48[2] = 0.0;
        lVar6 = 0;
        do {
          local_48[lVar6] = local_78[lVar6] * dVar11;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_98[0] = 0.0;
        local_98[1] = 0.0;
        local_98[2] = 0.0;
        lVar6 = 0;
        do {
          local_98[lVar6] = local_48[lVar6] * 4.8032045444;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        lVar6 = 0;
        do {
          (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6] =
               local_98[lVar6] + (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        bVar5 = AtomType::isDipole(*(AtomType **)(p_Var7 + 0x78));
        if (bVar5) {
          lVar6 = *(long *)(*(long *)(*(long *)(p_Var7 + 0x18) + 0x18) + 0xf0 +
                           *(long *)(p_Var7 + 0x10));
          local_98[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)*(int *)(p_Var7 + 0x30) * 0x18)
          ;
          pdVar1 = (double *)(lVar6 + (long)*(int *)(p_Var7 + 0x30) * 0x18);
          local_98[0] = *pdVar1;
          local_98[1] = pdVar1[1];
          lVar6 = 0;
          do {
            (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6] =
                 local_98[lVar6] + (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
        }
        pp_Var8 = pp_Var8 + 1;
      } while ((pp_Var8 != sd[2].properties_._vptr_PropertyMap) &&
              (p_Var7 = *pp_Var8, p_Var7 != (_func_int *)0x0));
    }
  }
  else if (sd->objType_ == otDAtom) {
    lVar6 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).dipole.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    local_78[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar6 + (long)sd->localIndex_ * 0x18);
    local_78[0] = *pdVar1;
    local_78[1] = pdVar1[1];
    lVar6 = 0;
    do {
      (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6] =
           local_78[lVar6] + (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d DipoleField::getValue(StuntDouble* sd) {
    const RealType eAtoDebye = 4.8032045444;
    Vector3d dipoleVector(0.0);

    if (sd->isDirectionalAtom()) {
      dipoleVector += static_cast<DirectionalAtom*>(sd)->getDipole();
    }

    if (sd->isRigidBody()) {
      RigidBody* rb = static_cast<RigidBody*>(sd);
      Atom* atom;
      RigidBody::AtomIterator ai;
      for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
        RealType charge(0.0);
        AtomType* atomType = atom->getAtomType();

        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        if (fca.isFixedCharge()) { charge = fca.getCharge(); }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

        Vector3d pos = atom->getPos();
        dipoleVector += pos * charge * eAtoDebye;

        if (atom->isDipole()) { dipoleVector += atom->getDipole(); }
      }
    }
    return dipoleVector;
  }